

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

bool ImGui::BeginTableEx(char *name,ImGuiID id,int columns_count,ImGuiTableFlags flags,
                        ImVec2 *outer_size,float inner_width)

{
  ImSpan<ImGuiTableColumn> *this;
  ImVec2 IVar1;
  double dVar2;
  short sVar3;
  ImGuiWindow *outer_window;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  ImU32 IVar9;
  ImPoolIdx i;
  ImGuiTable *p;
  float *pfVar10;
  ImGuiTableColumn *pIVar11;
  char *pcVar12;
  ImRect *pIVar13;
  ImS16 IVar14;
  ImGuiContext *g;
  int n;
  int iVar15;
  float fVar16;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar18 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  ImVec2 IVar17;
  undefined1 auVar21 [64];
  undefined1 auVar23 [56];
  undefined1 auVar22 [64];
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  float fVar30;
  undefined1 auVar31 [16];
  ImRect IVar32;
  uint local_b8;
  ImGuiID local_b4;
  ImRect outer_rect;
  ImGuiPtrOrIndex local_78;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined7 uStack_54;
  undefined1 uStack_4d;
  undefined7 uStack_4c;
  undefined4 uStack_45;
  undefined4 uStack_41;
  undefined1 extraout_var [56];
  undefined1 auVar29 [56];
  
  pIVar5 = GImGui;
  outer_window = GImGui->CurrentWindow;
  outer_window->WriteAccessed = true;
  if (outer_window->SkipItems != false) {
    return false;
  }
  if (0x3f < columns_count - 1U) {
    __assert_fail("columns_count > 0 && columns_count <= 64 && \"Only 1..64 columns allowed!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x133,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  if ((((uint)flags >> 0x18 & 1) != 0) && (inner_width < 0.0)) {
    __assert_fail("inner_width >= 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x135,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  auVar21._0_8_ = GetContentRegionAvail();
  auVar21._8_56_ = extraout_var;
  auVar19 = vmaxss_avx(auVar21._0_16_,ZEXT416(0x3f800000));
  if ((flags & 0x3000000U) == 0) {
    IVar17 = CalcItemSize(*outer_size,auVar19._0_4_,0.0);
    IVar1 = (outer_window->DC).CursorPos;
    auVar26._8_8_ = 0;
    auVar26._0_4_ = IVar1.x;
    auVar26._4_4_ = IVar1.y;
    auVar19._0_4_ = IVar17.x + IVar1.x;
    auVar19._4_4_ = IVar17.y + IVar1.y;
    auVar19._8_4_ = (float)extraout_XMM0_Qb_00 + 0.0;
    auVar19._12_4_ = (float)((ulong)extraout_XMM0_Qb_00 >> 0x20) + 0.0;
    outer_rect = (ImRect)vmovlhps_avx(auVar26,auVar19);
  }
  else {
    auVar26 = vmovshdup_avx(auVar21._0_16_);
    auVar26 = vmaxss_avx(auVar26,ZEXT416(0x3f800000));
    IVar17 = CalcItemSize(*outer_size,auVar19._0_4_,auVar26._0_4_);
    IVar1 = (outer_window->DC).CursorPos;
    auVar25._8_8_ = 0;
    auVar25._0_4_ = IVar1.x;
    auVar25._4_4_ = IVar1.y;
    auVar18._0_4_ = IVar17.x + IVar1.x;
    auVar18._4_4_ = IVar17.y + IVar1.y;
    auVar18._8_4_ = (float)extraout_XMM0_Qb + 0.0;
    auVar18._12_4_ = (float)((ulong)extraout_XMM0_Qb >> 0x20) + 0.0;
    outer_rect = (ImRect)vmovlhps_avx(auVar25,auVar18);
    bVar6 = IsClippedEx(&outer_rect,0,false);
    if (bVar6) {
      ItemSize(&outer_rect,-1.0);
      return false;
    }
  }
  p = ImPool<ImGuiTable>::GetOrAddByKey(&pIVar5->Tables,id);
  if (p->LastFrameActive == pIVar5->FrameCount) {
    sVar3 = p->InstanceCurrent;
    IVar14 = sVar3 + 1;
    local_b4 = (int)sVar3 + id + 1;
    local_b8 = p->Flags;
    if ((-1 < sVar3) && (p->ColumnsCount != columns_count)) {
      __assert_fail("table->ColumnsCount == columns_count && \"BeginTable(): Cannot change columns count mid-frame while preserving same ID\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                    ,0x148,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
  }
  else {
    local_b8 = p->Flags;
    IVar14 = 0;
    local_b4 = id;
  }
  p->IsDefaultSizingPolicy = (flags & 0xe000U) == 0;
  uVar7 = TableFixFlags(flags,outer_window);
  p->ID = id;
  p->Flags = uVar7;
  p->InstanceCurrent = IVar14;
  p->LastFrameActive = pIVar5->FrameCount;
  p->InnerWindow = outer_window;
  p->OuterWindow = outer_window;
  p->ColumnsCount = columns_count;
  p->IsLayoutLocked = false;
  p->InnerWidth = inner_width;
  p->UserOuterSize = *outer_size;
  if ((flags & 0x3000000U) == 0) {
    (p->InnerRect).Min = outer_rect.Min;
    (p->InnerRect).Max = outer_rect.Max;
    (p->OuterRect).Min = outer_rect.Min;
    (p->OuterRect).Max = outer_rect.Max;
    (p->WorkRect).Min = outer_rect.Min;
    (p->WorkRect).Max = outer_rect.Max;
  }
  else {
    uVar8 = uVar7 & 0x3000000;
    auVar19 = ZEXT416((uint)inner_width);
    if ((uVar7 & 0x1000000) == 0) {
      auVar19 = SUB6416(ZEXT464(0x7f7fffff),0);
    }
    auVar26 = vcmpss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)inner_width),1);
    auVar31._8_4_ = 0x7f7fffff;
    auVar31._0_8_ = 0x7f7fffff7f7fffff;
    auVar31._12_4_ = 0x7f7fffff;
    auVar19 = vblendvps_avx(auVar31,auVar19,auVar26);
    if (((uVar8 == 0x1000000) || (auVar19._0_4_ != 3.4028235e+38)) || (NAN(auVar19._0_4_))) {
      auVar26 = vcmpss_avx(auVar19,ZEXT416(0x7f7fffff),4);
      auVar26 = vpinsrb_avx(ZEXT416(auVar26._0_4_),CONCAT31((int3)(uVar8 >> 8),uVar8 == 0x1000000),4
                           );
      auVar26 = vpslld_avx(auVar26,0x1f);
      auVar19 = vblendps_avx(auVar19,_DAT_001e5f50,0xe);
      auVar26 = vpsrad_avx(auVar26,0x1f);
      auVar19 = vpand_avx(auVar26,auVar19);
      local_78.Ptr = auVar19._0_8_;
      SetNextWindowContentSize((ImVec2 *)&local_78);
    }
    if ((local_b8 & 0x3000000) == 0) {
      local_78.Ptr = (void *)0x0;
      SetNextWindowScroll((ImVec2 *)&local_78);
    }
    IVar32 = outer_rect;
    auVar20._8_8_ = 0;
    auVar20._0_4_ = outer_rect.Min.x;
    auVar20._4_4_ = outer_rect.Min.y;
    outer_rect.Max = IVar32.Max;
    auVar27._8_8_ = 0;
    auVar27._0_4_ = outer_rect.Max.x;
    auVar27._4_4_ = outer_rect.Max.y;
    auVar29 = ZEXT856(0);
    auVar19 = vsubps_avx(auVar27,auVar20);
    local_78.Ptr = (void *)vmovlps_avx(auVar19);
    outer_rect = IVar32;
    BeginChildEx(name,local_b4,(ImVec2 *)&local_78,false,(uVar7 & 0x1000000) >> 0xd);
    pIVar4 = pIVar5->CurrentWindow;
    p->InnerWindow = pIVar4;
    IVar1 = (pIVar4->WorkRect).Max;
    auVar23 = ZEXT856((ulong)IVar1);
    (p->WorkRect).Min = (pIVar4->WorkRect).Min;
    (p->WorkRect).Max = IVar1;
    IVar32 = ImGuiWindow::Rect(pIVar4);
    auVar28._0_8_ = IVar32.Max;
    auVar28._8_56_ = auVar29;
    auVar22._0_8_ = IVar32.Min;
    auVar22._8_56_ = auVar23;
    IVar32 = (ImRect)vmovlhps_avx(auVar22._0_16_,auVar28._0_16_);
    p->OuterRect = IVar32;
    pIVar4 = p->InnerWindow;
    IVar1 = (pIVar4->InnerRect).Max;
    (p->InnerRect).Min = (pIVar4->InnerRect).Min;
    (p->InnerRect).Max = IVar1;
    fVar16 = (pIVar4->WindowPadding).x;
    if ((((fVar16 != 0.0) || (NAN(fVar16))) ||
        ((fVar16 = (pIVar4->WindowPadding).y, fVar16 != 0.0 ||
         ((NAN(fVar16) || (pIVar4->WindowBorderSize != 0.0)))))) || (NAN(pIVar4->WindowBorderSize)))
    {
      __assert_fail("table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                    ,0x177,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
  }
  PushOverrideID(0);
  pIVar4 = p->InnerWindow;
  p->HostIndentX = (pIVar4->DC).Indent.x;
  IVar1 = (pIVar4->ClipRect).Max;
  (p->HostClipRect).Min = (pIVar4->ClipRect).Min;
  (p->HostClipRect).Max = IVar1;
  p->HostSkipItems = pIVar4->SkipItems;
  IVar1 = (pIVar4->WorkRect).Max;
  (p->HostBackupWorkRect).Min = (pIVar4->WorkRect).Min;
  (p->HostBackupWorkRect).Max = IVar1;
  IVar1 = (pIVar4->ParentWorkRect).Max;
  (p->HostBackupParentWorkRect).Min = (pIVar4->ParentWorkRect).Min;
  (p->HostBackupParentWorkRect).Max = IVar1;
  (p->HostBackupColumnsOffset).x = (outer_window->DC).ColumnsOffset.x;
  p->HostBackupPrevLineSize = (pIVar4->DC).PrevLineSize;
  p->HostBackupCurrLineSize = (pIVar4->DC).CurrLineSize;
  p->HostBackupCursorMaxPos = (pIVar4->DC).CursorMaxPos;
  p->HostBackupItemWidth = (outer_window->DC).ItemWidth;
  p->HostBackupItemWidthStackSize = (outer_window->DC).ItemWidthStack.Size;
  fVar16 = 0.0;
  fVar24 = 0.0;
  if ((uVar7 >> 9 & 1) != 0) {
    fVar24 = 1.0;
  }
  (pIVar4->DC).CurrLineSize.x = 0.0;
  (pIVar4->DC).CurrLineSize.y = 0.0;
  (pIVar4->DC).PrevLineSize.x = 0.0;
  (pIVar4->DC).PrevLineSize.y = 0.0;
  if ((uVar7 & 0x800200) == 0x200) {
    fVar30 = (pIVar5->Style).CellPadding.x;
LAB_0018553a:
    fVar16 = fVar30;
    fVar30 = 0.0;
  }
  else {
    fVar30 = 0.0;
    if ((uVar7 & 0x800200) != 0) goto LAB_0018553a;
    fVar30 = (pIVar5->Style).CellPadding.x;
  }
  p->CellSpacingX1 = fVar24 + fVar30;
  p->CellSpacingX2 = fVar30;
  p->CellPaddingX = fVar16;
  p->CellPaddingY = (pIVar5->Style).CellPadding.y;
  fVar24 = 0.0;
  fVar30 = 0.0;
  if ((uVar7 >> 10 & 1) != 0) {
    fVar30 = 1.0;
  }
  if ((uVar7 >> 0x16 & 1) == 0 && (uVar7 & 0x200400) != 0) {
    fVar24 = (pIVar5->Style).CellPadding.x;
  }
  p->OuterPaddingX = (fVar30 + fVar24) - fVar16;
  p->CurrentRow = -1;
  p->CurrentColumn = -1;
  p->RowBgColorCounter = 0;
  pIVar13 = &pIVar4->ClipRect;
  if (pIVar4 == outer_window) {
    pIVar13 = &p->WorkRect;
  }
  *(uint *)&p->field_0x90 = (uint)*(ushort *)&p->field_0x90;
  IVar1 = pIVar13->Max;
  (p->InnerClipRect).Min = pIVar13->Min;
  (p->InnerClipRect).Max = IVar1;
  ImRect::ClipWith(&p->InnerClipRect,&p->WorkRect);
  ImRect::ClipWithFull(&p->InnerClipRect,&p->HostClipRect);
  if ((uVar7 >> 0x11 & 1) == 0) {
    fVar16 = (pIVar4->ClipRect).Max.y;
  }
  else {
    auVar19 = vminss_avx(ZEXT416((uint)(p->InnerClipRect).Max.y),
                         ZEXT416((uint)(pIVar4->WorkRect).Max.y));
    fVar16 = auVar19._0_4_;
  }
  (p->InnerClipRect).Max.y = fVar16;
  fVar16 = (p->WorkRect).Min.y;
  p->RowPosY2 = fVar16;
  p->RowPosY1 = fVar16;
  p->RowTextBaseline = 0.0;
  p->FreezeRowsRequest = '\0';
  p->FreezeRowsCount = '\0';
  p->FreezeColumnsRequest = '\0';
  p->FreezeColumnsCount = '\0';
  p->IsUnfrozenRows = true;
  p->DeclColumnsCount = '\0';
  IVar9 = GetColorU32(0x2b,1.0);
  p->BorderColorStrong = IVar9;
  IVar9 = GetColorU32(0x2c,1.0);
  p->BorderColorLight = IVar9;
  i = ImPool<ImGuiTable>::GetIndex(&pIVar5->Tables,p);
  local_78.Ptr = (void *)0x0;
  local_78.Index = i;
  ImVector<ImGuiPtrOrIndex>::push_back(&pIVar5->CurrentTableStack,&local_78);
  pIVar5->CurrentTable = p;
  (outer_window->DC).CurrentTableIdx = i;
  if (pIVar4 != outer_window) {
    (pIVar4->DC).CurrentTableIdx = i;
  }
  if (((local_b8 & 2) != 0) && ((uVar7 & 2) == 0)) {
    p->IsResetDisplayOrderRequest = true;
  }
  if ((pIVar5->TablesLastTimeActive).Size <= i) {
    local_78.Ptr = (void *)CONCAT44(local_78.Ptr._4_4_,0xbf800000);
    ImVector<float>::resize(&pIVar5->TablesLastTimeActive,i + 1,(float *)&local_78);
  }
  dVar2 = pIVar5->Time;
  pfVar10 = ImVector<float>::operator[](&pIVar5->TablesLastTimeActive,i);
  *pfVar10 = (float)dVar2;
  p->MemoryCompacted = false;
  iVar15 = (int)(((long)(p->Columns).DataEnd - (long)(p->Columns).Data) / 0x68);
  if (iVar15 == columns_count || iVar15 == 0) {
    if (p->RawData == (void *)0x0) goto LAB_00185790;
  }
  else {
    MemFree(p->RawData);
    p->RawData = (void *)0x0;
LAB_00185790:
    TableBeginInitMemory(p,columns_count);
    p->IsSettingsRequestLoad = true;
    p->IsInitializing = true;
  }
  this = &p->Columns;
  if (p->IsResetAllRequest == true) {
    p->IsInitializing = true;
    p->IsResetAllRequest = false;
    p->IsSettingsRequestLoad = false;
    p->IsSettingsDirty = true;
    p->SettingsLoadedFlags = 0;
  }
  else if ((p->IsInitializing & 1U) == 0) goto LAB_001858c1;
  p->SettingsOffset = -1;
  p->IsSortSpecsDirty = true;
  p->InstanceInteracted = -1;
  p->ContextPopupColumn = -1;
  p->ReorderColumn = -1;
  p->LastResizedColumn = -1;
  p->HoveredColumnBody = -1;
  p->HoveredColumnBorder = -1;
  p->AutoFitSingleColumn = -1;
  p->ResizedColumn = -1;
  for (iVar15 = 0; columns_count != iVar15; iVar15 = iVar15 + 1) {
    pIVar11 = ImSpan<ImGuiTableColumn>::operator[](this,iVar15);
    uStack_58 = 0;
    uStack_54 = 0;
    uStack_4d = 0;
    uStack_4c = 0;
    local_78.Ptr = (void *)0x0;
    local_78.Index = 0;
    local_78._12_4_ = 0;
    uStack_68 = 0;
    uStack_64 = 0;
    uStack_60 = 0;
    uStack_5c = 0;
    uStack_45 = 0xffffff00;
    uStack_41 = 0xffffffff;
    auVar19 = ZEXT416(0) << 0x40;
    pIVar11->Flags = auVar19._0_4_;
    pIVar11->WidthGiven = (float)auVar19._4_4_;
    pIVar11->MinX = (float)auVar19._8_4_;
    pIVar11->MaxX = (float)auVar19._12_4_;
    pIVar11->WidthRequest = -1.0;
    pIVar11->StretchWeight = -1.0;
    pIVar11->InitStretchWeightOrWidth = 0.0;
    (pIVar11->ClipRect).Min.x = 0.0;
    *(undefined8 *)&(pIVar11->ClipRect).Min.y = 0;
    *(undefined8 *)&(pIVar11->ClipRect).Max.y = 0;
    pIVar11->WorkMinX = 0.0;
    pIVar11->WorkMaxX = 0.0;
    *(undefined8 *)((long)&pIVar11->WorkMinX + 3) = 0;
    *(undefined8 *)((long)&pIVar11->ItemWidth + 3) = 0;
    *(undefined8 *)((long)&pIVar11->ContentMaxXUnfrozen + 3) = 0;
    *(undefined8 *)((long)&pIVar11->ContentMaxXHeadersIdeal + 3) = 0xffffffffffffff00;
    pIVar11->DrawChannelCurrent = 0xff;
    pIVar11->DrawChannelFrozen = 0xff;
    pIVar11->DrawChannelUnfrozen = 0xff;
    pIVar11->IsEnabled = false;
    pIVar11->IsEnabledNextFrame = false;
    pIVar11->IsVisibleX = false;
    pIVar11->IsVisibleY = false;
    pIVar11->IsRequestOutput = false;
    pIVar11->IsSkipItems = false;
    pIVar11->IsPreserveWidthAuto = false;
    pIVar11->NavLayerCurrent = '\0';
    pIVar11->AutoFitQueue = '\0';
    pIVar11->CannotSkipItemsQueue = '\0';
    pIVar11->field_0x64 = 0;
    pIVar11->SortDirectionsAvailList = '\0';
    pIVar11->IsPreserveWidthAuto = true;
    pcVar12 = ImSpan<signed_char>::operator[](&p->DisplayOrderToIndex,iVar15);
    *pcVar12 = (ImGuiTableColumnIdx)iVar15;
    pIVar11->DisplayOrder = (ImGuiTableColumnIdx)iVar15;
    pIVar11->IsEnabled = true;
    pIVar11->IsEnabledNextFrame = true;
  }
LAB_001858c1:
  if (p->IsSettingsRequestLoad == true) {
    TableLoadSettings(p);
  }
  fVar16 = pIVar5->FontSize;
  fVar24 = p->RefScale;
  if ((fVar24 != 0.0) || (NAN(fVar24))) {
    if ((fVar24 != fVar16) || (NAN(fVar24) || NAN(fVar16))) {
      for (iVar15 = 0; columns_count != iVar15; iVar15 = iVar15 + 1) {
        pIVar11 = ImSpan<ImGuiTableColumn>::operator[](this,iVar15);
        fVar30 = pIVar11->WidthRequest;
        pIVar11 = ImSpan<ImGuiTableColumn>::operator[](this,iVar15);
        pIVar11->WidthRequest = (fVar16 / fVar24) * fVar30;
      }
    }
  }
  p->RefScale = fVar16;
  pIVar4->SkipItems = true;
  if (0 < (p->ColumnsNames).Buf.Size) {
    ImVector<char>::resize(&(p->ColumnsNames).Buf,0);
  }
  TableBeginApplyRequests(p);
  return true;
}

Assistant:

bool    ImGui::BeginTableEx(const char* name, ImGuiID id, int columns_count, ImGuiTableFlags flags, const ImVec2& outer_size, float inner_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* outer_window = GetCurrentWindow();
    if (outer_window->SkipItems) // Consistent with other tables + beneficial side effect that assert on miscalling EndTable() will be more visible.
        return false;

    // Sanity checks
    IM_ASSERT(columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && "Only 1..64 columns allowed!");
    if (flags & ImGuiTableFlags_ScrollX)
        IM_ASSERT(inner_width >= 0.0f);

    // If an outer size is specified ahead we will be able to early out when not visible. Exact clipping rules may evolve.
    const bool use_child_window = (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0;
    const ImVec2 avail_size = GetContentRegionAvail();
    ImVec2 actual_outer_size = CalcItemSize(outer_size, ImMax(avail_size.x, 1.0f), use_child_window ? ImMax(avail_size.y, 1.0f) : 0.0f);
    ImRect outer_rect(outer_window->DC.CursorPos, outer_window->DC.CursorPos + actual_outer_size);
    if (use_child_window && IsClippedEx(outer_rect, 0, false))
    {
        ItemSize(outer_rect);
        return false;
    }

    // Acquire storage for the table
    ImGuiTable* table = g.Tables.GetOrAddByKey(id);
    const int instance_no = (table->LastFrameActive != g.FrameCount) ? 0 : table->InstanceCurrent + 1;
    const ImGuiID instance_id = id + instance_no;
    const ImGuiTableFlags table_last_flags = table->Flags;
    if (instance_no > 0)
        IM_ASSERT(table->ColumnsCount == columns_count && "BeginTable(): Cannot change columns count mid-frame while preserving same ID");

    // Fix flags
    table->IsDefaultSizingPolicy = (flags & ImGuiTableFlags_SizingMask_) == 0;
    flags = TableFixFlags(flags, outer_window);

    // Initialize
    table->ID = id;
    table->Flags = flags;
    table->InstanceCurrent = (ImS16)instance_no;
    table->LastFrameActive = g.FrameCount;
    table->OuterWindow = table->InnerWindow = outer_window;
    table->ColumnsCount = columns_count;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    table->UserOuterSize = outer_size;

    // When not using a child window, WorkRect.Max will grow as we append contents.
    if (use_child_window)
    {
        // Ensure no vertical scrollbar appears if we only want horizontal one, to make flag consistent
        // (we have no other way to disable vertical scrollbar of a window while keeping the horizontal one showing)
        ImVec2 override_content_size(FLT_MAX, FLT_MAX);
        if ((flags & ImGuiTableFlags_ScrollX) && !(flags & ImGuiTableFlags_ScrollY))
            override_content_size.y = FLT_MIN;

        // Ensure specified width (when not specified, Stretched columns will act as if the width == OuterWidth and
        // never lead to any scrolling). We don't handle inner_width < 0.0f, we could potentially use it to right-align
        // based on the right side of the child window work rect, which would require knowing ahead if we are going to
        // have decoration taking horizontal spaces (typically a vertical scrollbar).
        if ((flags & ImGuiTableFlags_ScrollX) && inner_width > 0.0f)
            override_content_size.x = inner_width;

        if (override_content_size.x != FLT_MAX || override_content_size.y != FLT_MAX)
            SetNextWindowContentSize(ImVec2(override_content_size.x != FLT_MAX ? override_content_size.x : 0.0f, override_content_size.y != FLT_MAX ? override_content_size.y : 0.0f));

        // Reset scroll if we are reactivating it
        if ((table_last_flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) == 0)
            SetNextWindowScroll(ImVec2(0.0f, 0.0f));

        // Create scrolling region (without border and zero window padding)
        ImGuiWindowFlags child_flags = (flags & ImGuiTableFlags_ScrollX) ? ImGuiWindowFlags_HorizontalScrollbar : ImGuiWindowFlags_None;
        BeginChildEx(name, instance_id, outer_rect.GetSize(), false, child_flags);
        table->InnerWindow = g.CurrentWindow;
        table->WorkRect = table->InnerWindow->WorkRect;
        table->OuterRect = table->InnerWindow->Rect();
        table->InnerRect = table->InnerWindow->InnerRect;
        IM_ASSERT(table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f);
    }
    else
    {
        // For non-scrolling tables, WorkRect == OuterRect == InnerRect.
        // But at this point we do NOT have a correct value for .Max.y (unless a height has been explicitly passed in). It will only be updated in EndTable().
        table->WorkRect = table->OuterRect = table->InnerRect = outer_rect;
    }

    // Push a standardized ID for both child-using and not-child-using tables
    PushOverrideID(instance_id);

    // Backup a copy of host window members we will modify
    ImGuiWindow* inner_window = table->InnerWindow;
    table->HostIndentX = inner_window->DC.Indent.x;
    table->HostClipRect = inner_window->ClipRect;
    table->HostSkipItems = inner_window->SkipItems;
    table->HostBackupWorkRect = inner_window->WorkRect;
    table->HostBackupParentWorkRect = inner_window->ParentWorkRect;
    table->HostBackupColumnsOffset = outer_window->DC.ColumnsOffset;
    table->HostBackupPrevLineSize = inner_window->DC.PrevLineSize;
    table->HostBackupCurrLineSize = inner_window->DC.CurrLineSize;
    table->HostBackupCursorMaxPos = inner_window->DC.CursorMaxPos;
    table->HostBackupItemWidth = outer_window->DC.ItemWidth;
    table->HostBackupItemWidthStackSize = outer_window->DC.ItemWidthStack.Size;
    inner_window->DC.PrevLineSize = inner_window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);

    // Padding and Spacing
    // - None               ........Content..... Pad .....Content........
    // - PadOuter           | Pad ..Content..... Pad .....Content.. Pad |
    // - PadInner           ........Content.. Pad | Pad ..Content........
    // - PadOuter+PadInner  | Pad ..Content.. Pad | Pad ..Content.. Pad |
    const bool pad_outer_x = (flags & ImGuiTableFlags_NoPadOuterX) ? false : (flags & ImGuiTableFlags_PadOuterX) ? true : (flags & ImGuiTableFlags_BordersOuterV) != 0;
    const bool pad_inner_x = (flags & ImGuiTableFlags_NoPadInnerX) ? false : true;
    const float inner_spacing_for_border = (flags & ImGuiTableFlags_BordersInnerV) ? TABLE_BORDER_SIZE : 0.0f;
    const float inner_spacing_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) == 0) ? g.Style.CellPadding.x : 0.0f;
    const float inner_padding_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) != 0) ? g.Style.CellPadding.x : 0.0f;
    table->CellSpacingX1 = inner_spacing_explicit + inner_spacing_for_border;
    table->CellSpacingX2 = inner_spacing_explicit;
    table->CellPaddingX = inner_padding_explicit;
    table->CellPaddingY = g.Style.CellPadding.y;

    const float outer_padding_for_border = (flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
    const float outer_padding_explicit = pad_outer_x ? g.Style.CellPadding.x : 0.0f;
    table->OuterPaddingX = (outer_padding_for_border + outer_padding_explicit) - table->CellPaddingX;

    table->CurrentColumn = -1;
    table->CurrentRow = -1;
    table->RowBgColorCounter = 0;
    table->LastRowFlags = ImGuiTableRowFlags_None;
    table->InnerClipRect = (inner_window == outer_window) ? table->WorkRect : inner_window->ClipRect;
    table->InnerClipRect.ClipWith(table->WorkRect);     // We need this to honor inner_width
    table->InnerClipRect.ClipWithFull(table->HostClipRect);
    table->InnerClipRect.Max.y = (flags & ImGuiTableFlags_NoHostExtendY) ? ImMin(table->InnerClipRect.Max.y, inner_window->WorkRect.Max.y) : inner_window->ClipRect.Max.y;

    table->RowPosY1 = table->RowPosY2 = table->WorkRect.Min.y; // This is needed somehow
    table->RowTextBaseline = 0.0f; // This will be cleared again by TableBeginRow()
    table->FreezeRowsRequest = table->FreezeRowsCount = 0; // This will be setup by TableSetupScrollFreeze(), if any
    table->FreezeColumnsRequest = table->FreezeColumnsCount = 0;
    table->IsUnfrozenRows = true;
    table->DeclColumnsCount = 0;

    // Using opaque colors facilitate overlapping elements of the grid
    table->BorderColorStrong = GetColorU32(ImGuiCol_TableBorderStrong);
    table->BorderColorLight = GetColorU32(ImGuiCol_TableBorderLight);

    // Make table current
    const int table_idx = g.Tables.GetIndex(table);
    g.CurrentTableStack.push_back(ImGuiPtrOrIndex(table_idx));
    g.CurrentTable = table;
    outer_window->DC.CurrentTableIdx = table_idx;
    if (inner_window != outer_window) // So EndChild() within the inner window can restore the table properly.
        inner_window->DC.CurrentTableIdx = table_idx;

    if ((table_last_flags & ImGuiTableFlags_Reorderable) && (flags & ImGuiTableFlags_Reorderable) == 0)
        table->IsResetDisplayOrderRequest = true;

    // Mark as used
    if (table_idx >= g.TablesLastTimeActive.Size)
        g.TablesLastTimeActive.resize(table_idx + 1, -1.0f);
    g.TablesLastTimeActive[table_idx] = (float)g.Time;
    table->MemoryCompacted = false;

    // Setup memory buffer (clear data if columns count changed)
    const int stored_size = table->Columns.size();
    if (stored_size != 0 && stored_size != columns_count)
    {
        IM_FREE(table->RawData);
        table->RawData = NULL;
    }
    if (table->RawData == NULL)
    {
        TableBeginInitMemory(table, columns_count);
        table->IsInitializing = table->IsSettingsRequestLoad = true;
    }
    if (table->IsResetAllRequest)
        TableResetSettings(table);
    if (table->IsInitializing)
    {
        // Initialize
        table->SettingsOffset = -1;
        table->IsSortSpecsDirty = true;
        table->InstanceInteracted = -1;
        table->ContextPopupColumn = -1;
        table->ReorderColumn = table->ResizedColumn = table->LastResizedColumn = -1;
        table->AutoFitSingleColumn = -1;
        table->HoveredColumnBody = table->HoveredColumnBorder = -1;
        for (int n = 0; n < columns_count; n++)
        {
            ImGuiTableColumn* column = &table->Columns[n];
            float width_auto = column->WidthAuto;
            *column = ImGuiTableColumn();
            column->WidthAuto = width_auto;
            column->IsPreserveWidthAuto = true; // Preserve WidthAuto when reinitializing a live table: not technically necessary but remove a visible flicker
            column->DisplayOrder = table->DisplayOrderToIndex[n] = (ImGuiTableColumnIdx)n;
            column->IsEnabled = column->IsEnabledNextFrame = true;
        }
    }

    // Load settings
    if (table->IsSettingsRequestLoad)
        TableLoadSettings(table);

    // Handle DPI/font resize
    // This is designed to facilitate DPI changes with the assumption that e.g. style.CellPadding has been scaled as well.
    // It will also react to changing fonts with mixed results. It doesn't need to be perfect but merely provide a decent transition.
    // FIXME-DPI: Provide consistent standards for reference size. Perhaps using g.CurrentDpiScale would be more self explanatory.
    // This is will lead us to non-rounded WidthRequest in columns, which should work but is a poorly tested path.
    const float new_ref_scale_unit = g.FontSize; // g.Font->GetCharAdvance('A') ?
    if (table->RefScale != 0.0f && table->RefScale != new_ref_scale_unit)
    {
        const float scale_factor = new_ref_scale_unit / table->RefScale;
        //IMGUI_DEBUG_LOG("[table] %08X RefScaleUnit %.3f -> %.3f, scaling width by %.3f\n", table->ID, table->RefScaleUnit, new_ref_scale_unit, scale_factor);
        for (int n = 0; n < columns_count; n++)
            table->Columns[n].WidthRequest = table->Columns[n].WidthRequest * scale_factor;
    }
    table->RefScale = new_ref_scale_unit;

    // Disable output until user calls TableNextRow() or TableNextColumn() leading to the TableUpdateLayout() call..
    // This is not strictly necessary but will reduce cases were "out of table" output will be misleading to the user.
    // Because we cannot safely assert in EndTable() when no rows have been created, this seems like our best option.
    inner_window->SkipItems = true;

    // Clear names
    // At this point the ->NameOffset field of each column will be invalid until TableUpdateLayout() or the first call to TableSetupColumn()
    if (table->ColumnsNames.Buf.Size > 0)
        table->ColumnsNames.Buf.resize(0);

    // Apply queued resizing/reordering/hiding requests
    TableBeginApplyRequests(table);

    return true;
}